

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O2

void ST::apply_format<std::__cxx11::string>
               (format_writer *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg0)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  out_of_range *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  long lVar4;
  formatter_ref_t formatters [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  format_spec spec;
  
  std::__cxx11::string::string(&local_68,arg0);
  make_formatter_ref<std::__cxx11::string>(formatters,(ST *)&local_68,value);
  std::__cxx11::string::~string((string *)&local_68);
  lVar4 = 0;
  while( true ) {
    bVar2 = format_writer::next_format(data);
    if (!bVar2) {
      std::_Function_base::~_Function_base(&formatters[0].super__Function_base);
      return;
    }
    format_writer::parse_format(&spec,data);
    iVar1 = spec.arg_index;
    lVar3 = (long)spec.arg_index + -1;
    if ((long)spec.arg_index < 0) {
      lVar3 = lVar4;
    }
    if (lVar3 != 0) break;
    std::function<void_(const_ST::format_spec_&,_ST::format_writer_&)>::operator()
              (formatters,&spec,data);
    lVar4 = lVar4 + (ulong)((uint)iVar1 >> 0x1f);
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Parameter index out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void apply_format(ST::format_writer &data, arg0_T &&arg0, args_T &&...args)
    {
        enum { num_formatters = 1 + sizeof...(args) };
        formatter_ref_t formatters[num_formatters] = {
            make_formatter_ref(std::forward<arg0_T>(arg0)),
            make_formatter_ref(std::forward<args_T>(args))...
        };
        size_t index = 0;
        while (data.next_format()) {
            ST::format_spec spec = data.parse_format();
            size_t formatter_id = (spec.arg_index >= 0)
                                  ? spec.arg_index - 1
                                  : index++;
            if (formatter_id >= num_formatters)
                throw std::out_of_range("Parameter index out of range");
            formatters[formatter_id](spec, data);
        }
    }